

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O0

void web_server_accept(SOCKET lsock,fd_set *set)

{
  int *piVar1;
  undefined1 local_1a8 [8];
  char errorBuffer [256];
  undefined1 local_a0 [8];
  sockaddr_storage clientAddr;
  socklen_t clientLen;
  SOCKET asock;
  fd_set *set_local;
  SOCKET lsock_local;
  
  if ((lsock != -1) &&
     ((set->__fds_bits[lsock / 0x40] & 1L << ((byte)((long)lsock % 0x40) & 0x3f)) != 0)) {
    clientAddr.__ss_align._0_4_ = 0x80;
    clientAddr.__ss_align._4_4_ =
         accept(lsock,(sockaddr *)local_a0,(socklen_t *)&clientAddr.__ss_align);
    if (clientAddr.__ss_align._4_4_ == -1) {
      piVar1 = __errno_location();
      __xpg_strerror_r(*piVar1,local_1a8,0x100);
      UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x211,
                 "miniserver: Error in accept(): %s\n",local_1a8);
    }
    else {
      schedule_request_job(clientAddr.__ss_align._4_4_,(sockaddr *)local_a0);
    }
  }
  return;
}

Assistant:

static void web_server_accept(SOCKET lsock, fd_set *set)
{
	#ifdef INTERNAL_WEB_SERVER
	SOCKET asock;
	socklen_t clientLen;
	struct sockaddr_storage clientAddr;
	char errorBuffer[ERROR_BUFFER_LEN];

	if (lsock != INVALID_SOCKET && FD_ISSET(lsock, set)) {
		clientLen = sizeof(clientAddr);
		asock = accept(
			lsock, (struct sockaddr *)&clientAddr, &clientLen);
		if (asock == INVALID_SOCKET) {
			strerror_r(errno, errorBuffer, ERROR_BUFFER_LEN);
			UpnpPrintf(UPNP_INFO,
				MSERV,
				__FILE__,
				__LINE__,
				"miniserver: Error in accept(): %s\n",
				errorBuffer);
		} else {
			schedule_request_job(
				asock, (struct sockaddr *)&clientAddr);
		}
	}
	#endif /* INTERNAL_WEB_SERVER */
}